

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aalcalcmeanonly.cpp
# Opt level: O1

void aalcalcmeanonly::LoadOccurrence<occurrence>(occurrence *occ,FILE *fin)

{
  size_t sVar1;
  __node_base_ptr p_Var2;
  mapped_type *pmVar3;
  mapped_type *pmVar4;
  int iVar5;
  FILE *__stream;
  undefined1 *unaff_R12;
  undefined1 *unaff_R13;
  int *__k;
  bool bVar6;
  undefined4 uVar7;
  double dVar8;
  double dVar9;
  int iStack_9c;
  float fStack_98;
  key_type kStack_94;
  key_type akStack_90 [2];
  mapped_type mStack_88;
  double dStack_80;
  FILE *pFStack_78;
  undefined1 *puStack_70;
  undefined1 *puStack_68;
  occurrence *poStack_60;
  int *piStack_58;
  undefined1 auVar10 [16];
  
  fread(&nPeriods_,4,1,(FILE *)fin);
  __k = (int *)periodToWeighting_._24_8_;
  if (periodToWeighting_._24_8_ == 0) {
    dVar8 = 1.0;
  }
  else {
    dVar8 = 0.0;
  }
  __stream = (FILE *)occ;
  sVar1 = fread(occ,0xc,1,(FILE *)fin);
  if (sVar1 != 0) {
    auVar10._8_4_ = SUB84(__k,4);
    auVar10._0_8_ = __k;
    auVar10._12_4_ = 0x45300000;
    uVar7 = SUB84(__k,0);
    __k = &occ->period_no;
    unaff_R12 = periodToWeighting_;
    unaff_R13 = eventToWeighting_;
    do {
      p_Var2 = std::
               _Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
               ::_M_find_before_node
                         ((_Hashtable<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                           *)periodToWeighting_,(ulong)(long)*__k % (ulong)periodToWeighting_._8_8_,
                          __k,(long)*__k);
      dVar9 = dVar8;
      if ((p_Var2 != (__node_base_ptr)0x0) && (p_Var2->_M_nxt != (_Hash_node_base *)0x0)) {
        pmVar3 = std::__detail::
                 _Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)periodToWeighting_,__k);
        dVar9 = *pmVar3 * ((auVar10._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,uVar7) - 4503599627370496.0));
      }
      pmVar3 = std::__detail::
               _Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)eventToWeighting_,&occ->event_id);
      *pmVar3 = dVar9 + *pmVar3;
      if (maxPeriodNo_ < occ->period_no) {
        maxPeriodNo_ = occ->period_no;
      }
      __stream = (FILE *)occ;
      sVar1 = fread(occ,0xc,1,(FILE *)fin);
    } while (sVar1 != 0);
  }
  if (maxPeriodNo_ <= nPeriods_) {
    fclose((FILE *)fin);
    return;
  }
  LoadOccurrence<occurrence>();
  pFStack_78 = fin;
  puStack_70 = unaff_R12;
  puStack_68 = unaff_R13;
  poStack_60 = occ;
  piStack_58 = __k;
  sVar1 = fread(&kStack_94,0xc,1,__stream);
  if (sVar1 != 0) {
    do {
      pmVar3 = std::__detail::
               _Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<int,_std::pair<const_int,_double>,_std::allocator<std::pair<const_int,_double>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)eventToWeighting_,&kStack_94);
      mStack_88 = *pmVar3;
      do {
        sVar1 = fread(&iStack_9c,8,1,__stream);
        if (1 < iStack_9c + 5U) {
          if ((sVar1 == 0) || (iStack_9c == 0)) break;
          bVar6 = iStack_9c != -1;
          iVar5 = 1;
          if (bVar6) {
            iVar5 = sampleSize_;
          }
          dStack_80 = ((double)fStack_98 * mStack_88) / (double)iVar5;
          pmVar4 = std::
                   map<int,_std::array<double,_2UL>,_std::less<int>,_std::allocator<std::pair<const_int,_std::array<double,_2UL>_>_>_>
                   ::operator[]((map<int,_std::array<double,_2UL>,_std::less<int>,_std::allocator<std::pair<const_int,_std::array<double,_2UL>_>_>_>
                                 *)means_,akStack_90);
          pmVar4->_M_elems[bVar6] = dStack_80 + pmVar4->_M_elems[bVar6];
        }
      } while (sVar1 != 0);
      sVar1 = fread(&kStack_94,0xc,1,__stream);
    } while (sVar1 != 0);
  }
  return;
}

Assistant:

void LoadOccurrence(T &occ, FILE *fin) {

    size_t i = fread(&nPeriods_, sizeof(nPeriods_), 1, fin);
    double factor = (double)periodToWeighting_.size();
    double defaultWeighting = 1.0;
    if (periodToWeighting_.size() > 0) defaultWeighting = 0.0;

    i = fread(&occ, sizeof(occ), 1, fin);
    while (i != 0) {
      double weighting = defaultWeighting;
      if (periodToWeighting_.find(occ.period_no) != periodToWeighting_.end()) {
	weighting = periodToWeighting_[occ.period_no] * factor;
      }
      eventToWeighting_[occ.event_id] += weighting;
      if (maxPeriodNo_ < occ.period_no) maxPeriodNo_ = occ.period_no;
      i = fread(&occ, sizeof(occ), 1, fin);
    }

    if (maxPeriodNo_ > nPeriods_) {
      fprintf(stderr,
	      "FATAL: Maximum period number exceeds total number of periods in header of %s\n",
	      OCCURRENCE_FILE);
      exit(EXIT_FAILURE);
    }

    fclose(fin);

  }